

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

void Iso_FindNumbers(void)

{
  int iVar1;
  int local_1018;
  int local_1014;
  int j;
  int i;
  uchar *pNums;
  uint Nums [1024];
  
  srand(0x6f);
  for (local_1014 = 0; local_1014 < 0x1000; local_1014 = local_1014 + 1) {
    iVar1 = rand();
    *(char *)((long)Nums + (long)local_1014 + -8) = (char)iVar1;
  }
  for (local_1014 = 0; local_1014 < 0x80; local_1014 = local_1014 + 1) {
    printf("    ");
    for (local_1018 = 0; local_1018 < 8; local_1018 = local_1018 + 1) {
      printf("0x%08x,",(ulong)Nums[(long)(local_1014 * 8 + local_1018) + -2]);
    }
    printf("\n");
  }
  return;
}

Assistant:

void Iso_FindNumbers()
{
    unsigned Nums[1024];
    unsigned char * pNums = (unsigned char *)Nums;
    int i, j;
    srand( 111 );
    for ( i = 0; i < 1024 * 4; i++ )
        pNums[i] = (unsigned char)rand();
    // write out
    for ( i = 0; i < 128; i++ )
    {
        printf( "    " );
        for ( j = 0; j < 8; j++ )
            printf( "0x%08x,", Nums[i*8+j] );
        printf( "\n" );
    }
}